

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_message.c
# Opt level: O0

int mpt_array_message(mpt_array *arr,mpt_message *ptr,int asep)

{
  size_t sVar1;
  void *pvVar2;
  mpt_type_traits *pmVar3;
  int local_64;
  int narg;
  ssize_t len;
  char *base;
  mpt_array a;
  mpt_message msg;
  int asep_local;
  mpt_message *ptr_local;
  mpt_array *arr_local;
  
  memset(&base,0,8);
  local_64 = 0;
  if ((ptr == (mpt_message *)0x0) || (sVar1 = mpt_message_length(ptr), sVar1 == 0)) {
    mpt_array_clone(arr,(mpt_array *)0x0);
    arr_local._4_4_ = 0;
  }
  else {
    pvVar2 = mpt_array_slice((mpt_array *)&base,0,sVar1 + 1);
    if (pvVar2 == (void *)0x0) {
      arr_local._4_4_ = -4;
    }
    else {
      base[0x18] = '\0';
      base[0x19] = '\0';
      base[0x1a] = '\0';
      base[0x1b] = '\0';
      base[0x1c] = '\0';
      base[0x1d] = '\0';
      base[0x1e] = '\0';
      base[0x1f] = '\0';
      a._buf = (mpt_buffer *)ptr->used;
      while (sVar1 = mpt_message_argv((mpt_message *)&a,asep), -1 < (long)sVar1) {
        if (sVar1 == 0) {
          if (asep != 0) break;
        }
        else {
          pvVar2 = mpt_array_append((mpt_array *)&base,sVar1,(void *)0x0);
          if (pvVar2 == (void *)0x0) {
            mpt_array_clone((mpt_array *)&base,(mpt_array *)0x0);
            return -0x11;
          }
          mpt_message_read((mpt_message *)&a,sVar1,pvVar2);
        }
        local_64 = local_64 + 1;
        pvVar2 = mpt_array_append((mpt_array *)&base,1,(void *)0x0);
        if (pvVar2 == (void *)0x0) {
          mpt_array_clone((mpt_array *)&base,(mpt_array *)0x0);
          return -0x11;
        }
        mpt_message_read((mpt_message *)&a,1,(void *)0x0);
      }
      pmVar3 = mpt_type_traits(99);
      *(mpt_type_traits **)(base + 8) = pmVar3;
      mpt_array_clone(arr,(mpt_array *)&base);
      mpt_array_clone((mpt_array *)&base,(mpt_array *)0x0);
      arr_local._4_4_ = local_64;
    }
  }
  return arr_local._4_4_;
}

Assistant:

extern int mpt_array_message(MPT_STRUCT(array) *arr, const MPT_STRUCT(message) *ptr, int asep)
{
	MPT_STRUCT(message) msg;
	MPT_STRUCT(array) a = MPT_ARRAY_INIT;
	char *base;
	ssize_t len;
	int narg = 0;
	
	if (!ptr || !(len = mpt_message_length(ptr))) {
		mpt_array_clone(arr, 0);
		return narg;
	}
	/* prepare for maximum size */
	if (!(base = mpt_array_slice(&a, 0, len+1))) {
		return MPT_ERROR(BadOperation);
	}
	a._buf->_used = 0;
	
	msg = *ptr;
	while ((len = mpt_message_argv(&msg, asep)) >= 0) {
		if (!len) {
			if (asep) {
				break;
			}
		}
		else if (!(base = mpt_array_append(&a, len, 0))) {
			mpt_array_clone(&a, 0);
			return MPT_ERROR(MissingBuffer);
		}
		/* save next argument to array */
		else {
			mpt_message_read(&msg, len, base);
		}
		++narg;
		/* save argument separation */
		if (!(base = mpt_array_append(&a, 1, 0))) {
			mpt_array_clone(&a, 0);
			return MPT_ERROR(MissingBuffer);
		}
		/* skip argument separation */
		mpt_message_read(&msg, 1, 0);
	}
	a._buf->_content_traits = mpt_type_traits('c');
	mpt_array_clone(arr, &a);
	mpt_array_clone(&a, 0);
	return narg;
}